

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O1

shared_ptr<JSONHandler> make_all_handler(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_JSONHandler::Members_*,_false> _Var2;
  JSONHandler *pJVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<JSONHandler> sVar5;
  shared_ptr<JSONHandler> h5;
  shared_ptr<JSONHandler> h6ab;
  shared_ptr<JSONHandler> h6a;
  shared_ptr<JSONHandler> h6;
  shared_ptr<JSONHandler> h4;
  shared_ptr<JSONHandler> h5s;
  shared_ptr<JSONHandler> h6ax;
  shared_ptr<JSONHandler> h3;
  shared_ptr<JSONHandler> h2;
  shared_ptr<JSONHandler> h1;
  string local_478;
  JSONHandler *local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  JSONHandler *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  JSONHandler *local_438;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  JSONHandler *local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_420;
  JSONHandler *local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  JSONHandler *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  JSONHandler *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  JSONHandler *local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  JSONHandler *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  JSONHandler *local_3c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  json_handler_t local_3b8;
  json_handler_t local_398;
  json_handler_t local_378;
  json_handler_t local_358;
  shared_ptr<JSONHandler> local_330;
  shared_ptr<JSONHandler> local_320;
  shared_ptr<JSONHandler> local_310;
  shared_ptr<JSONHandler> local_300;
  shared_ptr<JSONHandler> local_2f0;
  shared_ptr<JSONHandler> local_2e0;
  shared_ptr<JSONHandler> local_2d0;
  shared_ptr<JSONHandler> local_2c0;
  shared_ptr<JSONHandler> local_2b0;
  shared_ptr<JSONHandler> local_2a0;
  shared_ptr<JSONHandler> local_290;
  shared_ptr<JSONHandler> local_280;
  shared_ptr<JSONHandler> local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  _Any_data local_1d8;
  code *local_1c8;
  _Any_data local_1b8;
  code *local_1a8;
  _Any_data local_198;
  code *local_188;
  _Any_data local_178;
  code *local_168;
  string_handler_t local_158;
  json_handler_t local_138;
  void_handler_t local_118;
  string_handler_t local_f8;
  bool_handler_t local_d8;
  json_handler_t local_b8;
  bool_handler_t local_98;
  string_handler_t local_78;
  string_handler_t local_58;
  
  (in_RDI->m)._M_t.
  super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
  super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
  super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl = (Members *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 1),(JSONHandler **)in_RDI,
             (allocator<JSONHandler> *)&local_478);
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_358.super__Function_base._M_functor._8_8_ = 0;
  local_358.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_358._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_358.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_260 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 1);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"dict end","");
  make_print_message((void_handler_t *)&local_178,&local_1f8);
  JSONHandler::addDictHandlers
            ((JSONHandler *)_Var2._M_head_impl,&local_358,(void_handler_t *)&local_178);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_358.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_358.super__Function_base._M_manager)
              ((_Any_data *)&local_358,(_Any_data *)&local_358,__destroy_functor);
  }
  local_3c8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3c0,&local_3c8,(allocator<JSONHandler> *)&local_478);
  local_58.super__Function_base._M_functor._8_8_ = 0;
  local_58.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_58._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_58.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_3c8,&local_58);
  if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.super__Function_base._M_manager)
              ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  paVar1 = &local_478.field_2;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"one","");
  local_270.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3c8;
  local_270.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3c0._M_pi;
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3c0._M_pi)->_M_use_count = (local_3c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3c0._M_pi)->_M_use_count = (local_3c0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler((JSONHandler *)_Var2._M_head_impl,&local_478,&local_270);
  if (local_270.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_3d8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3d0,&local_3d8,(allocator<JSONHandler> *)&local_478);
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78.super__Function_base._M_functor._M_unused._M_object = print_number;
  local_78._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_78.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addNumberHandler(local_3d8,&local_78);
  if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.super__Function_base._M_manager)
              ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"two","");
  local_280.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3d8;
  local_280.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3d0._M_pi;
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler((JSONHandler *)_Var2._M_head_impl,&local_478,&local_280);
  if (local_280.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_3e8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3e0,&local_3e8,(allocator<JSONHandler> *)&local_478);
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_functor._M_unused._M_object = print_bool;
  local_98._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_manager;
  JSONHandler::addBoolHandler(local_3e8,&local_98);
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"three","");
  local_290.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3e8;
  local_290.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3e0._M_pi;
  if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3e0._M_pi)->_M_use_count = (local_3e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3e0._M_pi)->_M_use_count = (local_3e0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler((JSONHandler *)_Var2._M_head_impl,&local_478,&local_290);
  if (local_290.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_418 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_410,&local_418,(allocator<JSONHandler> *)&local_478);
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_b8._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  JSONHandler::addAnyHandler(local_418,&local_b8);
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"four","");
  local_2a0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_418;
  local_2a0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_410._M_pi;
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler((JSONHandler *)_Var2._M_head_impl,&local_478,&local_2a0);
  if (local_2a0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"phour","");
  local_2b0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_418;
  local_2b0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_410._M_pi;
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler((JSONHandler *)_Var2._M_head_impl,&local_478,&local_2b0);
  if (local_2b0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_458 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_450,&local_458,(allocator<JSONHandler> *)&local_478);
  local_d8.super__Function_base._M_functor._8_8_ = 0;
  local_d8.super__Function_base._M_functor._M_unused._M_object = print_bool;
  local_d8._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_invoke;
  local_d8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_manager;
  JSONHandler::addBoolHandler(local_458,&local_d8);
  if (local_d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d8.super__Function_base._M_manager)
              ((_Any_data *)&local_d8,(_Any_data *)&local_d8,__destroy_functor);
  }
  local_f8.super__Function_base._M_functor._8_8_ = 0;
  local_f8.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_f8._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_f8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_458,&local_f8);
  if (local_f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f8.super__Function_base._M_manager)
              ((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  local_118.super__Function_base._M_functor._8_8_ = 0;
  local_118.super__Function_base._M_functor._M_unused._M_object = print_null;
  local_118._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_118.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addNullHandler(local_458,&local_118);
  if (local_118.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_118.super__Function_base._M_manager)
              ((_Any_data *)&local_118,(_Any_data *)&local_118,__destroy_functor);
  }
  local_408 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_400,&local_408,(allocator<JSONHandler> *)&local_478);
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"five","");
  local_2c0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_408;
  local_2c0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_400._M_pi;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler((JSONHandler *)_Var2._M_head_impl,&local_478,&local_2c0);
  if (local_2c0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  pJVar3 = local_408;
  local_378.super__Function_base._M_functor._8_8_ = 0;
  local_378.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_378._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_378.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"array end","");
  make_print_message((void_handler_t *)&local_198,&local_218);
  local_2d0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_458;
  local_2d0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_450._M_pi;
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_450._M_pi)->_M_use_count = (local_450._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_450._M_pi)->_M_use_count = (local_450._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addArrayHandlers(pJVar3,&local_378,(void_handler_t *)&local_198,&local_2d0);
  if (local_2d0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_378.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_378.super__Function_base._M_manager)
              ((_Any_data *)&local_378,(_Any_data *)&local_378,__destroy_functor);
  }
  local_2e0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_458;
  local_2e0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_450._M_pi;
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_450._M_pi)->_M_use_count = (local_450._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_450._M_pi)->_M_use_count = (local_450._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addFallbackHandler(local_408,&local_2e0);
  if (local_2e0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_428 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_420,&local_428,(allocator<JSONHandler> *)&local_478);
  pJVar3 = local_428;
  local_398.super__Function_base._M_functor._8_8_ = 0;
  local_398.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_398._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_398.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"dict end","");
  make_print_message((void_handler_t *)&local_1b8,&local_238);
  JSONHandler::addDictHandlers(pJVar3,&local_398,(void_handler_t *)&local_1b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_398.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_398.super__Function_base._M_manager)
              ((_Any_data *)&local_398,(_Any_data *)&local_398,__destroy_functor);
  }
  local_438 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_430,&local_438,(allocator<JSONHandler> *)&local_478);
  pJVar3 = local_428;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"a","");
  local_2f0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_438;
  local_2f0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_430._M_pi;
  if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_430._M_pi)->_M_use_count = (local_430._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_430._M_pi)->_M_use_count = (local_430._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar3,&local_478,&local_2f0);
  if (local_2f0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f0.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  pJVar3 = local_438;
  local_3b8.super__Function_base._M_functor._8_8_ = 0;
  local_3b8.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_3b8._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_3b8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"dict end","");
  make_print_message((void_handler_t *)&local_1d8,&local_258);
  JSONHandler::addDictHandlers(pJVar3,&local_3b8,(void_handler_t *)&local_1d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_3b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3b8.super__Function_base._M_manager)
              ((_Any_data *)&local_3b8,(_Any_data *)&local_3b8,__destroy_functor);
  }
  local_448 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_440,&local_448,(allocator<JSONHandler> *)&local_478);
  pJVar3 = local_438;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"b","");
  local_300.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_448;
  local_300.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_440._M_pi;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar3,&local_478,&local_300);
  if (local_300.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_300.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_3f8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3f0,&local_3f8,(allocator<JSONHandler> *)&local_478);
  local_138.super__Function_base._M_functor._8_8_ = 0;
  local_138.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_138._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_138.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  JSONHandler::addAnyHandler(local_3f8,&local_138);
  if (local_138.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.super__Function_base._M_manager)
              ((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
  }
  local_310.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3f8;
  local_310.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3f0._M_pi;
  if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addFallbackDictHandler(local_438,&local_310);
  if (local_310.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_310.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pJVar3 = local_428;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"b","");
  local_320.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_448;
  local_320.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_440._M_pi;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar3,&local_478,&local_320);
  if (local_320.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_320.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_158.super__Function_base._M_functor._8_8_ = 0;
  local_158.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_158._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_158.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_448,&local_158);
  if (local_158.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.super__Function_base._M_manager)
              ((_Any_data *)&local_158,(_Any_data *)&local_158,__destroy_functor);
  }
  _Var2._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_478._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"six","");
  local_330.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_428;
  local_330.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_420._M_pi;
  if (local_420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_420._M_pi)->_M_use_count = (local_420._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_420._M_pi)->_M_use_count = (local_420._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler((JSONHandler *)_Var2._M_head_impl,&local_478,&local_330);
  _Var4._M_pi = extraout_RDX;
  if (local_330.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var4._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != paVar1) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_01;
  }
  if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
    _Var4._M_pi = extraout_RDX_02;
  }
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
    _Var4._M_pi = extraout_RDX_03;
  }
  if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430._M_pi);
    _Var4._M_pi = extraout_RDX_04;
  }
  if (local_420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_420._M_pi);
    _Var4._M_pi = extraout_RDX_05;
  }
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
    _Var4._M_pi = extraout_RDX_06;
  }
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
    _Var4._M_pi = extraout_RDX_07;
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
    _Var4._M_pi = extraout_RDX_08;
  }
  if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0._M_pi);
    _Var4._M_pi = extraout_RDX_09;
  }
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0._M_pi);
    _Var4._M_pi = extraout_RDX_10;
  }
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
    _Var4._M_pi = extraout_RDX_11;
  }
  sVar5.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<JSONHandler>)sVar5.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<JSONHandler>
make_all_handler()
{
    auto h = std::make_shared<JSONHandler>();
    h->addDictHandlers(print_json, make_print_message("dict end"));
    auto h1 = std::make_shared<JSONHandler>();
    h1->addStringHandler(print_string);
    h->addDictKeyHandler("one", h1);
    auto h2 = std::make_shared<JSONHandler>();
    h2->addNumberHandler(print_number);
    h->addDictKeyHandler("two", h2);
    auto h3 = std::make_shared<JSONHandler>();
    h3->addBoolHandler(print_bool);
    h->addDictKeyHandler("three", h3);
    auto h4 = std::make_shared<JSONHandler>();
    h4->addAnyHandler(print_json);
    h->addDictKeyHandler("four", h4);
    h->addDictKeyHandler("phour", h4); // share h4
    auto h5 = std::make_shared<JSONHandler>();
    // Allow to be either string or bool
    h5->addBoolHandler(print_bool);
    h5->addStringHandler(print_string);
    h5->addNullHandler(print_null);
    auto h5s = std::make_shared<JSONHandler>();
    h->addDictKeyHandler("five", h5s);
    h5s->addArrayHandlers(print_json, make_print_message("array end"), h5);
    h5s->addFallbackHandler(h5);
    auto h6 = std::make_shared<JSONHandler>();
    h6->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6a = std::make_shared<JSONHandler>();
    h6->addDictKeyHandler("a", h6a);
    h6a->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6ab = std::make_shared<JSONHandler>();
    h6a->addDictKeyHandler("b", h6ab);
    auto h6ax = std::make_shared<JSONHandler>();
    h6ax->addAnyHandler(print_json);
    h6a->addFallbackDictHandler(h6ax);
    h6->addDictKeyHandler("b", h6ab); // share
    h6ab->addStringHandler(print_string);
    h->addDictKeyHandler("six", h6);
    return h;
}